

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.cpp
# Opt level: O2

void llvm::yaml::MappingTraits<llvm::DWARFYAML::AttributeAbbrev>::mapping
               (IO *IO,AttributeAbbrev *AttAbbrev)

{
  yaml::IO::mapRequired<llvm::dwarf::Attribute>(IO,"Attribute",&AttAbbrev->Attribute);
  yaml::IO::mapRequired<llvm::dwarf::Form>(IO,"Form",&AttAbbrev->Form);
  if (AttAbbrev->Form == DW_FORM_implicit_const) {
    yaml::IO::mapRequired<llvm::yaml::Hex64>(IO,"Value",&AttAbbrev->Value);
    return;
  }
  return;
}

Assistant:

void MappingTraits<DWARFYAML::AttributeAbbrev>::mapping(
    IO &IO, DWARFYAML::AttributeAbbrev &AttAbbrev) {
  IO.mapRequired("Attribute", AttAbbrev.Attribute);
  IO.mapRequired("Form", AttAbbrev.Form);
  if(AttAbbrev.Form == dwarf::DW_FORM_implicit_const)
    IO.mapRequired("Value", AttAbbrev.Value);
}